

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O0

char __thiscall Fl_Preferences::set(Fl_Preferences *this,char *key,char *text)

{
  byte bVar1;
  byte *value;
  char *local_58;
  byte *pbStack_40;
  char c;
  char *d;
  char *buffer;
  int ns;
  int n;
  char *s;
  char *text_local;
  char *key_local;
  Fl_Preferences *this_local;
  
  local_58 = text;
  if (text == (char *)0x0) {
    local_58 = "";
  }
  buffer._4_4_ = 0;
  buffer._0_4_ = 0;
  for (_ns = (byte *)local_58; *_ns != '\0'; _ns = (byte *)((char *)_ns + 1)) {
    buffer._4_4_ = buffer._4_4_ + 1;
    if ((((char)*_ns < ' ') || (*_ns == '\\')) || (*_ns == '\x7f')) {
      buffer._0_4_ = (int)buffer + 4;
    }
  }
  if ((int)buffer == 0) {
    Node::set(this->node,key,text);
  }
  else {
    value = (byte *)malloc((long)(buffer._4_4_ + (int)buffer + 1));
    pbStack_40 = value;
    for (_ns = (byte *)text; *_ns != 0; _ns = _ns + 1) {
      bVar1 = *_ns;
      if (bVar1 == 0x5c) {
        *pbStack_40 = 0x5c;
        pbStack_40[1] = 0x5c;
        pbStack_40 = pbStack_40 + 2;
      }
      else if (bVar1 == 10) {
        *pbStack_40 = 0x5c;
        pbStack_40[1] = 0x6e;
        pbStack_40 = pbStack_40 + 2;
      }
      else if (bVar1 == 0xd) {
        *pbStack_40 = 0x5c;
        pbStack_40[1] = 0x72;
        pbStack_40 = pbStack_40 + 2;
      }
      else if (((char)bVar1 < ' ') || (bVar1 == 0x7f)) {
        *pbStack_40 = 0x5c;
        pbStack_40[1] = ((char)bVar1 >> 6 & 3U) + 0x30;
        pbStack_40[2] = ((char)bVar1 >> 3 & 7U) + 0x30;
        pbStack_40[3] = (bVar1 & 7) + 0x30;
        pbStack_40 = pbStack_40 + 4;
      }
      else {
        *pbStack_40 = *_ns;
        pbStack_40 = pbStack_40 + 1;
      }
    }
    *pbStack_40 = 0;
    Node::set(this->node,key,(char *)value);
    free(value);
  }
  return '\x01';
}

Assistant:

char Fl_Preferences::set( const char *key, const char *text ) {
  const char *s = text ? text : "";
  int n=0, ns=0;
  for ( ; *s; s++ ) { n++; if ( *s<32 || *s=='\\' || *s==0x7f ) ns+=4; }
  if ( ns ) {
    char *buffer = (char*)malloc( n+ns+1 ), *d = buffer;
    for ( s=text; *s; ) {
      char c = *s;
      if ( c=='\\' ) { *d++ = '\\'; *d++ = '\\'; s++; }
      else if ( c=='\n' ) { *d++ = '\\'; *d++ = 'n'; s++; }
      else if ( c=='\r' ) { *d++ = '\\'; *d++ = 'r'; s++; }
      else if ( c<32 || c==0x7f )
	{ *d++ = '\\'; *d++ = '0'+((c>>6)&3); *d++ = '0'+((c>>3)&7); *d++ = '0'+(c&7);  s++; }
      else *d++ = *s++;
    }
    *d = 0;
    node->set( key, buffer );
    free( buffer );
  }
  else
    node->set( key, text );
  return 1;
}